

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O0

void finish(cbify *data)

{
  bool bVar1;
  reference pvVar2;
  long in_RDI;
  v_array<ACTION_SCORE::action_score> as;
  iterator __end2;
  iterator __begin2;
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  *__range2;
  size_t a;
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  *in_stack_ffffffffffffffa8;
  v_array<ACTION_SCORE::action_score> *in_stack_ffffffffffffffb0;
  example *in_stack_ffffffffffffffb8;
  action_score *in_stack_ffffffffffffffc0;
  __normal_iterator<v_array<ACTION_SCORE::action_score>_*,_std::vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>_>
  local_20;
  long local_18;
  ulong local_10;
  long local_8;
  
  local_8 = in_RDI;
  (*(code *)PTR_delete_label_0048fd38)(in_RDI);
  v_array<ACTION_SCORE::action_score>::delete_v(in_stack_ffffffffffffffb0);
  if ((*(byte *)(local_8 + 0x58) & 1) != 0) {
    for (local_10 = 0; local_10 < *(ulong *)(local_8 + 0x78); local_10 = local_10 + 1) {
      std::vector<example_*,_std::allocator<example_*>_>::operator[]
                ((vector<example_*,_std::allocator<example_*>_> *)(local_8 + 0x60),local_10);
      v_array<ACTION_SCORE::action_score>::delete_v(in_stack_ffffffffffffffb0);
      in_stack_ffffffffffffffb0 = (v_array<ACTION_SCORE::action_score> *)PTR_delete_label_0048fd38;
      std::vector<example_*,_std::allocator<example_*>_>::operator[]
                ((vector<example_*,_std::allocator<example_*>_> *)(local_8 + 0x60),local_10);
      VW::dealloc_example((_func_void_void_ptr *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                          ,(_func_void_void_ptr *)in_stack_ffffffffffffffb0);
      std::vector<example_*,_std::allocator<example_*>_>::operator[]
                ((vector<example_*,_std::allocator<example_*>_> *)(local_8 + 0x60),local_10);
      free_it((void *)0x2854b6);
    }
    std::vector<example_*,_std::allocator<example_*>_>::~vector
              ((vector<example_*,_std::allocator<example_*>_> *)in_stack_ffffffffffffffc0);
    std::vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
    ::~vector((vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
               *)in_stack_ffffffffffffffc0);
    std::vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::~vector
              ((vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *)
               in_stack_ffffffffffffffc0);
    local_18 = local_8 + 0xb8;
    local_20._M_current =
         (v_array<ACTION_SCORE::action_score> *)
         std::
         vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
         ::begin(in_stack_ffffffffffffffa8);
    std::
    vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
    ::end(in_stack_ffffffffffffffa8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<v_array<ACTION_SCORE::action_score>_*,_std::vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>_>
                          *)in_stack_ffffffffffffffb0,
                         (__normal_iterator<v_array<ACTION_SCORE::action_score>_*,_std::vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>_>
                          *)in_stack_ffffffffffffffa8);
      if (!bVar1) break;
      pvVar2 = __gnu_cxx::
               __normal_iterator<v_array<ACTION_SCORE::action_score>_*,_std::vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>_>
               ::operator*(&local_20);
      in_stack_ffffffffffffffc0 = pvVar2->_end;
      v_array<ACTION_SCORE::action_score>::delete_v(in_stack_ffffffffffffffb0);
      __gnu_cxx::
      __normal_iterator<v_array<ACTION_SCORE::action_score>_*,_std::vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>_>
      ::operator++(&local_20);
    }
    std::
    vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
    ::~vector((vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
               *)in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void finish(cbify& data)
{
  CB::cb_label.delete_label(&data.cb_label);
  data.a_s.delete_v();

  if (data.use_adf)
  {
    for (size_t a = 0; a < data.adf_data.num_actions; ++a)
      {
        data.adf_data.ecs[a]->pred.a_s.delete_v();
        VW::dealloc_example(CB::cb_label.delete_label, *data.adf_data.ecs[a]);
        free_it(data.adf_data.ecs[a]);
      }
    data.adf_data.ecs.~vector<example*>();
    data.cs_costs.~vector<v_array<COST_SENSITIVE::wclass>>();
    data.cb_costs.~vector<v_array<CB::cb_class>>();
    for (auto as : data.cb_as)
      as.delete_v();
    data.cb_as.~vector<ACTION_SCORE::action_scores>();
  }
}